

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O1

void prvTidyfreeStdIOFileSource(TidyInputSource *inp,Bool closeIt)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)inp->sourceData;
  if ((puVar1 != (undefined8 *)0x0 && closeIt != no) && ((FILE *)*puVar1 != (FILE *)0x0)) {
    fclose((FILE *)*puVar1);
  }
  tidyBufFree((TidyBuffer *)(puVar1 + 1));
  if (puVar1 != (undefined8 *)0x0) {
    (**(code **)(*(long *)puVar1[1] + 0x10))((long *)puVar1[1],puVar1);
    return;
  }
  return;
}

Assistant:

void TY_(freeFileSource)( TidyInputSource* inp, Bool closeIt )
{
    FileSource* fin = (FileSource*) inp->sourceData;
    if ( closeIt && fin && fin->fp )
      fclose( fin->fp );
    tidyBufFree( &fin->unget );
    if (fin)
        TidyFree( fin->unget.allocator, fin );
}